

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::SimpleRecurrentLayerParams
          (SimpleRecurrentLayerParams *this,SimpleRecurrentLayerParams *from)

{
  void *pvVar1;
  ActivationParams *from_00;
  WeightParams *pWVar2;
  uint64 uVar3;
  ActivationParams *this_00;
  WeightParams *pWVar4;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__SimpleRecurrentLayerParams_00344450;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->activation_;
  if (from_00 == (ActivationParams *)0x0 ||
      from == (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    this_00 = (ActivationParams *)0x0;
  }
  else {
    this_00 = (ActivationParams *)operator_new(0x20);
    ActivationParams::ActivationParams(this_00,from_00);
  }
  this->activation_ = this_00;
  pWVar2 = from->weightmatrix_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->weightmatrix_ = pWVar4;
  pWVar2 = from->recursionmatrix_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->recursionmatrix_ = pWVar4;
  pWVar2 = from->biasvector_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->biasvector_ = pWVar4;
  uVar3 = from->outputvectorsize_;
  this->inputvectorsize_ = from->inputvectorsize_;
  this->outputvectorsize_ = uVar3;
  *(undefined4 *)((long)&this->outputvectorsize_ + 7) =
       *(undefined4 *)((long)&from->outputvectorsize_ + 7);
  return;
}

Assistant:

SimpleRecurrentLayerParams::SimpleRecurrentLayerParams(const SimpleRecurrentLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_activation()) {
    activation_ = new ::CoreML::Specification::ActivationParams(*from.activation_);
  } else {
    activation_ = NULL;
  }
  if (from.has_weightmatrix()) {
    weightmatrix_ = new ::CoreML::Specification::WeightParams(*from.weightmatrix_);
  } else {
    weightmatrix_ = NULL;
  }
  if (from.has_recursionmatrix()) {
    recursionmatrix_ = new ::CoreML::Specification::WeightParams(*from.recursionmatrix_);
  } else {
    recursionmatrix_ = NULL;
  }
  if (from.has_biasvector()) {
    biasvector_ = new ::CoreML::Specification::WeightParams(*from.biasvector_);
  } else {
    biasvector_ = NULL;
  }
  ::memcpy(&inputvectorsize_, &from.inputvectorsize_,
    reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&inputvectorsize_) + sizeof(reverseinput_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SimpleRecurrentLayerParams)
}